

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

char16 * __thiscall Js::LazyJSONString::GetSz(LazyJSONString *this)

{
  JSONProperty *jsonContent;
  LazyJSONString *buffer;
  charcount_t bufferLength;
  bool bVar1;
  ScriptContext *pSVar2;
  Recycler *pRVar3;
  JSONProperty **ppJVar4;
  char16_t **ppcVar5;
  nullptr_t local_a0;
  undefined1 local_98 [8];
  JSONStringBuilder builder;
  TrackAllocData local_58;
  LazyJSONString *local_30;
  char16 *target;
  Recycler *recycler;
  LazyJSONString *pLStack_18;
  charcount_t allocSize;
  LazyJSONString *this_local;
  
  pLStack_18 = this;
  bVar1 = JavascriptString::IsFinalized(&this->super_JavascriptString);
  if (bVar1) {
    this_local = (LazyJSONString *)JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
  }
  else {
    recycler._4_4_ = JavascriptString::SafeSzSize(&this->super_JavascriptString);
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pRVar3 = ScriptContext::GetRecycler(pSVar2);
    target = (char16 *)pRVar3;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&char16_t::typeinfo,0,(ulong)recycler._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
               ,0xbb);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
    builder._40_8_ = Memory::Recycler::AllocLeaf;
    local_30 = (LazyJSONString *)
               Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeaf,0,
                          (ulong)recycler._4_4_);
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JSONProperty__
                        ((WriteBarrierPtr *)&this->jsonContent);
    bufferLength = recycler._4_4_;
    buffer = local_30;
    jsonContent = *ppJVar4;
    ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)&this->gap);
    JSONStringBuilder::JSONStringBuilder
              ((JSONStringBuilder *)local_98,pSVar2,jsonContent,(char16 *)buffer,bufferLength,
               *ppcVar5,*(charcount_t *)&(this->super_JavascriptString).field_0x1c);
    JSONStringBuilder::Build((JSONStringBuilder *)local_98);
    JavascriptString::SetBuffer(&this->super_JavascriptString,(char16 *)local_30);
    local_a0 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::JSONProperty>::operator=(&this->jsonContent,&local_a0);
    this_local = local_30;
  }
  return (char16 *)this_local;
}

Assistant:

const char16*
LazyJSONString::GetSz()
{
    if (this->IsFinalized())
    {
        return this->UnsafeGetBuffer();
    }

    const charcount_t allocSize = this->SafeSzSize();

    Recycler* recycler = GetScriptContext()->GetRecycler();
    char16* target = RecyclerNewArrayLeaf(recycler, char16, allocSize);

    JSONStringBuilder builder(
        this->GetScriptContext(),
        this->jsonContent,
        target,
        allocSize,
        this->gap,
        this->gapLength);

    builder.Build();

    this->SetBuffer(target);

    // You probably aren't going to parse if you are using the string buffer
    // Let's throw away the metadata so we can reclaim the memory
    this->jsonContent = nullptr;

    return target;
}